

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

int Abc_NtkLatchIsSelfFeed_rec(Abc_Obj_t *pLatch,Abc_Obj_t *pLatchRoot)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pLatchRoot_local;
  Abc_Obj_t *pLatch_local;
  
  iVar1 = Abc_ObjIsLatch(pLatch);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsLatch(pLatch)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                  ,0x33,"int Abc_NtkLatchIsSelfFeed_rec(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pLatch == pLatchRoot) {
    pLatch_local._4_4_ = 1;
  }
  else {
    pAVar2 = Abc_ObjFanin0(pLatch);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_ObjIsBo(pAVar2);
    if (iVar1 != 0) {
      pObj = Abc_ObjFanin0(pAVar2);
      iVar1 = Abc_ObjIsLatch(pObj);
      if (iVar1 != 0) {
        pAVar2 = Abc_ObjFanin0(pAVar2);
        iVar1 = Abc_NtkLatchIsSelfFeed_rec(pAVar2,pLatch);
        return iVar1;
      }
    }
    pLatch_local._4_4_ = 0;
  }
  return pLatch_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks if latches form self-loop.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Abc_NtkLatchIsSelfFeed_rec( Abc_Obj_t * pLatch, Abc_Obj_t * pLatchRoot )
{
    Abc_Obj_t * pFanin;
    assert( Abc_ObjIsLatch(pLatch) );
    if ( pLatch == pLatchRoot )
        return 1;
    pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
    if ( !Abc_ObjIsBo(pFanin) || !Abc_ObjIsLatch(Abc_ObjFanin0(pFanin)) )
        return 0;
    return Abc_NtkLatchIsSelfFeed_rec( Abc_ObjFanin0(pFanin), pLatch );
}